

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds00_reverse.cpp
# Opt level: O1

void reverse(vector<int,_std::allocator<int>_> *v,int a,int b)

{
  int iVar1;
  pointer piVar2;
  int iVar3;
  int i;
  long lVar4;
  
  iVar3 = (b + a) / 2;
  if (a <= iVar3) {
    piVar2 = (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    lVar4 = 0;
    do {
      iVar1 = piVar2[a + lVar4];
      piVar2[a + lVar4] = piVar2[(long)a + (long)b + -1];
      piVar2[(long)a + (long)b + -1] = iVar1;
      lVar4 = lVar4 + 1;
    } while ((iVar3 - a) + 1 != (int)lVar4);
  }
  return;
}

Assistant:

void reverse(vector<int> &v, int a, int b) {
    // write your code only in this function
    auto beg = v.begin();
    for (int i = a; i < (a + b) / 2 + 1; i++) {
        iter_swap(beg + i, beg + a + b - 1);
    }
}